

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O3

Token __thiscall flow::lang::Lexer::continueParseIPv6(Lexer *this,bool firstComplete)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Token TVar4;
  undefined7 in_register_00000031;
  char cVar5;
  allocator<char> local_39;
  Report *local_38;
  _List_node_base *local_28;
  
  if ((int)CONCAT71(in_register_00000031,firstComplete) == 0) {
    this->ipv6HexDigits_ = (this->stringValue_)._M_string_length;
    bVar2 = ipv6HexPart(this);
LAB_00135a09:
    if (this->currentChar_ == 0x2e) {
      cVar5 = (char)this + -0x58;
      do {
        iVar3 = std::istream::peek();
        if (9 < iVar3 - 0x30U) break;
        std::__cxx11::string::push_back(cVar5);
        nextChar(this,true);
        iVar3 = this->currentChar_;
        while (iVar3 - 0x30U < 10) {
          std::__cxx11::string::push_back(cVar5);
          nextChar(this,true);
          iVar3 = this->currentChar_;
        }
      } while (iVar3 == 0x2e);
    }
    if (bVar2 != false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stack0xffffffffffffffc8,(this->stringValue_)._M_dataplus._M_p,&local_39)
      ;
      (this->ipValue_).family_ = V6;
      iVar3 = inet_pton(10,(char *)local_38,(this->ipValue_).buf_);
      if (iVar3 < 1) {
        if (iVar3 < 0) {
          perror("inet_pton");
        }
        else {
          continueParseIPv6((Lexer *)&stack0xffffffffffffffc8);
        }
        (this->ipValue_).cstr_[0] = '\0';
      }
      else {
        strncpy((this->ipValue_).cstr_,(char *)local_38,0x2e);
      }
      if (local_38 != (Report *)&stack0xffffffffffffffd8) {
        operator_delete(local_38,(ulong)((long)&local_28->_M_next + 1));
      }
      if (0 < iVar3) {
        if (this->currentChar_ == 0x2f) {
          TVar4 = continueCidr(this,0x80);
          return TVar4;
        }
        this->token_ = IP;
        return IP;
      }
    }
  }
  else {
    bVar2 = true;
    do {
      if (this->currentChar_ != 0x3a) goto LAB_00135a09;
      iVar3 = std::istream::peek();
      if (iVar3 == 0x3a) {
        if ((this->currentChar_ == 0x3a) && (iVar3 = std::istream::peek(), iVar3 == 0x3a)) {
          std::__cxx11::string::append((char *)&this->stringValue_);
          nextChar(this,true);
          nextChar(this,true);
          iVar3 = isxdigit(this->currentChar_);
          if (iVar3 != 0) {
            bVar2 = ipv6HexSeq(this);
          }
        }
        goto LAB_00135a09;
      }
      std::__cxx11::string::push_back((char)&this->stringValue_);
      nextChar(this,true);
      bVar1 = ipv6HexDigit4(this);
    } while (bVar1);
  }
  this->token_ = Unknown;
  return Unknown;
}

Assistant:

Token Lexer::continueParseIPv6(bool firstComplete) {
  bool rv = true;
  if (firstComplete) {
    while (currentChar() == ':' && peekChar() != ':') {
      stringValue_ += ':';
      nextChar();

      if (!ipv6HexDigit4()) {
        return token_ = Token::Unknown;
      }
    }

    if (currentChar() == ':' && peekChar() == ':') {
      stringValue_ += "::";
      nextChar();
      nextChar();
      rv = isHexChar() ? ipv6HexSeq() : true;
    }
  } else {
    ipv6HexDigits_ = stringValue_.size();
    rv = ipv6HexPart();
  }

  // parse embedded IPv4 remainer
  while (currentChar_ == '.' && std::isdigit(peekChar())) {
    stringValue_ += '.';
    nextChar();

    while (std::isdigit(currentChar_)) {
      stringValue_ += static_cast<char>(currentChar_);
      nextChar();
    }
  }

  if (!rv)
    // Invalid IPv6
    return token_ = Token::Unknown;

  if (!ipValue_.set(stringValue_.c_str(), util::IPAddress::Family::V6))
    // Invalid IPv6
    return token_ = Token::Unknown;

  if (currentChar_ != '/') return token_ = Token::IP;

  return continueCidr(128);
}